

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::Connection::destroy(Connection *this)

{
  Logger *this_00;
  double __x;
  Connection *this_local;
  
  if ((this->destroy_ & 1U) == 0) {
    this->destroy_ = true;
    this_00 = Logger::getLogger();
    Logger::log(this_00,__x);
    std::__shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>);
    std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::clear(&this->writTasks_);
    std::function<void_(Liby::Connection_&)>::operator=(&this->erroEventCallback_,(nullptr_t)0x0);
    std::function<void_(Liby::Connection_&)>::operator=(&this->readEventCallback_,(nullptr_t)0x0);
    std::__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void Connection::destroy() {
    if (destroy_)
        return;
    else
        destroy_ = true;
    verbose("try to destroy connection %p", this);
    chan_.reset();
    socket_.reset();
    writTasks_.clear();
    erroEventCallback_ = nullptr;
    readEventCallback_ = nullptr;
    self_.reset();
}